

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O3

EStatusCode __thiscall OpenTypeFileInput::ReadOpenTypeSFNT(OpenTypeFileInput *this)

{
  OpenTypePrimitiveReader *this_00;
  EStatusCode EVar1;
  Trace *this_01;
  uint uVar2;
  unsigned_long offsetTable;
  unsigned_long numFonts;
  unsigned_long sfntVersion;
  unsigned_long ttcVersion;
  unsigned_long local_40;
  ulong local_38;
  unsigned_long local_30;
  unsigned_long local_28;
  
  this_00 = &this->mPrimitivesReader;
  OpenTypePrimitiveReader::SetOffset(this_00,this->mHeaderOffset);
  OpenTypePrimitiveReader::ReadULONG(this_00,&local_30);
  EVar1 = OpenTypePrimitiveReader::GetInternalState(this_00);
  if (EVar1 != eSuccess) {
    return eFailure;
  }
  if ((long)local_30 < 0x74727565) {
    if (local_30 != 0x10000) {
      if (local_30 == 0x4f54544f) {
        this->mFontType = EOpenTypeCFF;
        return eSuccess;
      }
LAB_001bf87b:
      EVar1 = ReadOpenTypeSFNTFromDfont(this);
      return -(uint)(EVar1 != eSuccess);
    }
  }
  else if (local_30 != 0x74727565) {
    if (local_30 == 0x74746366) {
      OpenTypePrimitiveReader::ReadULONG(this_00,&local_28);
      OpenTypePrimitiveReader::ReadULONG(this_00,&local_38);
      if (local_38 <= this->mFaceIndex) {
        this_01 = Trace::DefaultTrace();
        Trace::TraceToLog(this_01,
                          "OpenTypeFileInput::ReadOpenTypeSFNT, face index %d out of range. Max font count is %ld"
                          ,(ulong)this->mFaceIndex,local_38);
        return eFailure;
      }
      uVar2 = 0xffffffff;
      do {
        OpenTypePrimitiveReader::ReadULONG(this_00,&local_40);
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->mFaceIndex);
      this->mHeaderOffset = this->mHeaderOffset + local_40;
      EVar1 = ReadOpenTypeSFNT(this);
      return EVar1;
    }
    goto LAB_001bf87b;
  }
  this->mFontType = EOpenTypeTrueType;
  return eSuccess;
}

Assistant:

EStatusCode OpenTypeFileInput::ReadOpenTypeSFNT()
{
	unsigned long sfntVersion;

    mPrimitivesReader.SetOffset(mHeaderOffset);
	mPrimitivesReader.ReadULONG(sfntVersion);
    
    if(mPrimitivesReader.GetInternalState() != PDFHummus::eSuccess)
    {
        return PDFHummus::eFailure;
    }
    
    if((0x74746366 /* ttcf */ == sfntVersion))
    {
        // mgubi: a TrueType composite font, just get to the right face table 
        // for the format see http://www.microsoft.com/typography/otspec/otff.htm
        
        unsigned long ttcVersion;
        unsigned long numFonts;
        unsigned long offsetTable;
        
        mPrimitivesReader.ReadULONG(ttcVersion);
        mPrimitivesReader.ReadULONG(numFonts);
        
        if (mFaceIndex >= numFonts) 
        {
            TRACE_LOG2("OpenTypeFileInput::ReadOpenTypeSFNT, face index %d out of range. Max font count is %ld",mFaceIndex,numFonts);
            return PDFHummus::eFailure;
        }
        
        for (int i= 0; i<= mFaceIndex; ++i) {
            mPrimitivesReader.ReadULONG(offsetTable);
        }
        
        mHeaderOffset = mHeaderOffset + offsetTable;
        
        return ReadOpenTypeSFNT();
    } else if((0x10000 == sfntVersion) || (0x74727565 /* true */ == sfntVersion))
	{
		mFontType = EOpenTypeTrueType;
		return PDFHummus::eSuccess;
	}
	else if(0x4F54544F /* OTTO */ == sfntVersion)
	{
		mFontType = EOpenTypeCFF;
		return PDFHummus::eSuccess;
	}
	else if ((ReadOpenTypeSFNTFromDfont() == PDFHummus::eSuccess))
    {
		return PDFHummus::eSuccess;
    }
    else
		return PDFHummus::eFailure;
}